

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_operators.cpp
# Opt level: O3

void __thiscall tst_qpromise_operators::equalTo_void(tst_qpromise_operators *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  bool bVar3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar4;
  char cVar5;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar6;
  char *pcVar7;
  char *pcVar8;
  bool local_4a;
  bool local_49;
  QPromise<void> p1;
  QPromise<void> p0;
  
  QtPromise::QPromise<void>::resolve();
  QtPromise::QPromise<void>::resolve();
  QVar4 = p1.super_QPromiseBase<void>.m_d;
  if (p1.super_QPromiseBase<void>.m_d.d == (PromiseData<void> *)0x0) {
    QVar6.d = (PromiseData<void> *)0x0;
  }
  else {
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    QVar6 = p1.super_QPromiseBase<void>.m_d;
  }
  local_49 = p0.super_QPromiseBase<void>.m_d.d == QVar6.d;
  bVar3 = !local_49;
  local_4a = false;
  pcVar7 = QTest::toString<bool>(&local_49);
  pcVar8 = QTest::toString<bool>(&local_4a);
  cVar5 = QTest::compare_helper
                    (bVar3,"Compared values are not the same",pcVar7,pcVar8,"p0 == p1","false",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                     ,0xa8);
  if (cVar5 != '\0') {
    local_49 = p0.super_QPromiseBase<void>.m_d.d == QVar4.d;
    bVar3 = !local_49;
    local_4a = false;
    pcVar7 = QTest::toString<bool>(&local_49);
    pcVar8 = QTest::toString<bool>(&local_4a);
    cVar5 = QTest::compare_helper
                      (bVar3,"Compared values are not the same",pcVar7,pcVar8,"p0 == p2","false",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                       ,0xa9);
    if (cVar5 != '\0') {
      local_49 = p0.super_QPromiseBase<void>.m_d.d == QVar4.d;
      bVar3 = !local_49;
      local_4a = false;
      pcVar7 = QTest::toString<bool>(&local_49);
      pcVar8 = QTest::toString<bool>(&local_4a);
      cVar5 = QTest::compare_helper
                        (bVar3,"Compared values are not the same",pcVar7,pcVar8,"p0 == p3","false",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                         ,0xaa);
      QVar6 = p1.super_QPromiseBase<void>.m_d;
      if (cVar5 != '\0') {
        local_49 = p1.super_QPromiseBase<void>.m_d.d == QVar4.d;
        local_4a = true;
        pcVar7 = QTest::toString<bool>(&local_49);
        pcVar8 = QTest::toString<bool>(&local_4a);
        cVar5 = QTest::compare_helper
                          (QVar6.d == QVar4.d,"Compared values are not the same",pcVar7,pcVar8,
                           "p1 == p2","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                           ,0xab);
        QVar6 = p1.super_QPromiseBase<void>.m_d;
        if (cVar5 != '\0') {
          local_49 = p1.super_QPromiseBase<void>.m_d.d == QVar4.d;
          local_4a = true;
          pcVar7 = QTest::toString<bool>(&local_49);
          pcVar8 = QTest::toString<bool>(&local_4a);
          cVar5 = QTest::compare_helper
                            (QVar6.d == QVar4.d,"Compared values are not the same",pcVar7,pcVar8,
                             "p1 == p3","true",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                             ,0xac);
          if (cVar5 != '\0') {
            local_49 = true;
            local_4a = true;
            pcVar7 = QTest::toString<bool>(&local_49);
            pcVar8 = QTest::toString<bool>(&local_4a);
            QTest::compare_helper
                      (true,"Compared values are not the same",pcVar7,pcVar8,"p2 == p3","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                       ,0xad);
          }
        }
      }
    }
  }
  if (QVar4.d != (PromiseData<void> *)0x0) {
    pQVar1 = &((QVar4.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    LOCK();
    pQVar2 = &((QVar4.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      (*((QVar4.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase[1])(QVar4.d);
    }
    LOCK();
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      (*((QVar4.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase[1])(QVar4.d);
    }
  }
  p1.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011bae0;
  if (p1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_operators::equalTo_void()
{
    auto p0 = QtPromise::QPromise<void>::resolve();
    auto p1 = QtPromise::QPromise<void>::resolve();
    auto p2 = p1;
    auto p3(p2);

    QCOMPARE(p0 == p1, false);
    QCOMPARE(p0 == p2, false);
    QCOMPARE(p0 == p3, false);
    QCOMPARE(p1 == p2, true);
    QCOMPARE(p1 == p3, true);
    QCOMPARE(p2 == p3, true);
}